

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_opc_mxu__pool04(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  TCGContext_conflict4 *s;
  uint uVar1;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i32 a2;
  uintptr_t o_1;
  uint uVar2;
  TCGOpcode opc;
  uintptr_t o_2;
  uintptr_t o_3;
  TCGv_i32 ret;
  
  s = *(TCGContext_conflict4 **)(*(long *)((env->active_tc).HI + 3) + 0x2e8);
  a1 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  a1_00 = tcg_temp_new_internal_mipsel(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1_00 - (long)s);
  uVar2 = (env->active_tc).gpr[10];
  uVar1 = uVar2 >> 0x15 & 0x1f;
  if (uVar1 == 0) {
    opc = INDEX_op_movi_i32;
    a2 = (TCGv_i32)0x0;
  }
  else {
    if (s->cpu_gpr[uVar1] == (TCGv_i32)((long)a1 - (long)s)) goto LAB_00850645;
    a2 = (TCGv_i32)((long)&s->pool_cur + (long)s->cpu_gpr[uVar1]);
    opc = INDEX_op_mov_i32;
  }
  tcg_gen_op2_mipsel(s,opc,(TCGArg)a1,(TCGArg)a2);
LAB_00850645:
  tcg_gen_op2_mipsel(s,INDEX_op_movi_i32,(TCGArg)a1_00,(ulong)(uVar2 >> 10 & 0x3ff));
  tcg_gen_shli_i32_mipsel(s,ret,ret,2);
  if ((uVar2 >> 0x13 & 1) != 0) {
    tcg_gen_ori_i32_mipsel(s,ret,ret,-0x1000);
  }
  tcg_gen_op3_mipsel(s,INDEX_op_add_i32,(TCGArg)a1_00,(TCGArg)a1,(TCGArg)a1_00);
  tcg_gen_qemu_ld_i32_mipsel(s,ret,ret,(long)(int)(env->active_tc).gpr[0x12],MO_LESL);
  if ((uVar2 >> 0x14 & 1) != 0) {
    tcg_gen_bswap32_i32_mipsel(s,ret,ret);
  }
  uVar2 = (uVar2 >> 6 & 0xf) - 1;
  if ((uVar2 < 0xf) && (s->mxu_gpr[uVar2] != ret)) {
    tcg_gen_op2_mipsel(s,INDEX_op_mov_i32,(TCGArg)(s->mxu_gpr[uVar2] + (long)s),(TCGArg)a1_00);
  }
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)((TCGv_i32)((long)a1 - (long)s) + (long)s));
  tcg_temp_free_internal_mipsel(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void decode_opc_mxu__pool04(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 20, 1);

    switch (opcode) {
    case OPC_MXU_S32LDD:
    case OPC_MXU_S32LDDR:
        gen_mxu_s32ldd_s32lddr(ctx);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}